

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

Reference __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MakeCommonExpr
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int index)

{
  Reference RVar1;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  RVar1 = BasicExprFactory<std::allocator<char>_>::MakeCommonExpr(in_stack_ffffffffffffffd8,0);
  return (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)
         RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
}

Assistant:

auto MakeCommonExpr(int index) {
    MP_ASSERT__RAISE(common_expr(index).is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    return ExprFactory::MakeCommonExpr(index);
  }